

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

int asn1_item_ex_d2i(ASN1_VALUE **pval,uchar **in,long len,ASN1_ITEM *it,int tag,int aclass,char opt
                    ,CRYPTO_BUFFER *buf,int depth)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  ASN1_VALUE **ppAVar9;
  ASN1_TEMPLATE *pAVar10;
  ASN1_TEMPLATE *pAVar11;
  code *local_f8;
  code *local_f0;
  ASN1_VALUE **pseqval_2;
  ASN1_TEMPLATE *seqtt_2;
  ASN1_VALUE **pseqval_1;
  ASN1_TEMPLATE *seqtt_1;
  ASN1_VALUE **pseqval;
  ASN1_TEMPLATE *seqtt;
  ASN1_aux_cb *asn1_cb_1;
  ASN1_AUX *aux_1;
  ASN1_aux_cb *asn1_cb;
  ASN1_AUX *aux;
  ASN1_EXTERN_FUNCS *ef;
  ASN1_VALUE **pchptr;
  int ret;
  int otag;
  int i;
  char isopt;
  char cst;
  uchar oclass;
  uchar *q;
  uchar *p;
  ASN1_TEMPLATE *errtt;
  ASN1_TEMPLATE *tt;
  int aclass_local;
  int tag_local;
  ASN1_ITEM *it_local;
  long len_local;
  uchar **in_local;
  ASN1_VALUE **pval_local;
  
  p = (uchar *)0x0;
  q = (uchar *)0x0;
  pchptr._0_4_ = 0;
  if (pval == (ASN1_VALUE **)0x0) {
    return 0;
  }
  tt._0_4_ = aclass;
  tt._4_4_ = tag;
  _aclass_local = (ASN1_ITEM *)it;
  it_local = (ASN1_ITEM *)len;
  len_local = (long)in;
  in_local = (uchar **)pval;
  if (buf != (CRYPTO_BUFFER *)0x0) {
    puVar6 = CRYPTO_BUFFER_data(buf);
    bVar2 = false;
    if (puVar6 <= *(uint8_t **)len_local) {
      lVar1 = *(long *)len_local;
      pcVar3 = &it_local->itype;
      puVar6 = CRYPTO_BUFFER_data(buf);
      sVar7 = CRYPTO_BUFFER_len(buf);
      bVar2 = pcVar3 + lVar1 <= puVar6 + sVar7;
    }
    if (!bVar2) {
      __assert_fail("CRYPTO_BUFFER_data(buf) <= *in && *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0xa7,
                    "int asn1_item_ex_d2i(ASN1_VALUE **, const unsigned char **, long, const ASN1_ITEM *, int, int, char, CRYPTO_BUFFER *, int)"
                   );
    }
  }
  if (0x3fffffff < (long)it_local) {
    it_local = (ASN1_ITEM *)0x3fffffff;
  }
  iVar4 = depth + 1;
  if (0x1e < iVar4) {
    ERR_put_error(0xc,0,0xc0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0xb1);
    pAVar10 = (ASN1_TEMPLATE *)p;
    goto LAB_002f3118;
  }
  switch(_aclass_local->itype) {
  case '\0':
    if ((ASN1_TEMPLATE *)_aclass_local->utype == (ASN1_TEMPLATE *)0x0) {
      iVar4 = asn1_d2i_ex_primitive
                        ((ASN1_VALUE **)in_local,(uchar **)len_local,(long)it_local,
                         (ASN1_ITEM *)_aclass_local,tt._4_4_,(int)tt,opt);
      return iVar4;
    }
    if ((tt._4_4_ == -1) && (opt == '\0')) {
      iVar4 = asn1_template_ex_d2i
                        ((ASN1_VALUE **)in_local,(uchar **)len_local,(long)it_local,
                         (ASN1_TEMPLATE *)_aclass_local->utype,'\0',buf,iVar4);
      return iVar4;
    }
    ERR_put_error(0xc,0,0x88,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0xbd);
    pAVar10 = (ASN1_TEMPLATE *)p;
    break;
  case '\x01':
    q = *(uchar **)len_local;
    if (tt._4_4_ == -1) {
      tt._4_4_ = 0x10;
      tt._0_4_ = 0;
    }
    pchptr._0_4_ = asn1_check_tlen((long *)&it_local,(int *)0x0,(uchar *)0x0,
                                   (char *)((long)&otag + 2),&q,(long)it_local,tt._4_4_,(int)tt,opt)
    ;
    if ((int)pchptr == 0) {
      ERR_put_error(0xc,0,0x9e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x143);
      pAVar10 = (ASN1_TEMPLATE *)p;
      break;
    }
    if ((int)pchptr == -1) {
      return -1;
    }
    if (otag._2_1_ == '\0') {
      ERR_put_error(0xc,0,0xa9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x149);
      pAVar10 = (ASN1_TEMPLATE *)p;
      break;
    }
    if ((*in_local == (uchar *)0x0) &&
       (iVar5 = ASN1_item_ex_new((ASN1_VALUE **)in_local,_aclass_local), iVar5 == 0)) {
      ERR_put_error(0xc,0,0x9e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x14e);
      pAVar10 = (ASN1_TEMPLATE *)p;
      break;
    }
    if ((void *)_aclass_local->tcount == (void *)0x0) {
      local_f8 = (code *)0x0;
    }
    else {
      local_f8 = *(code **)(_aclass_local->tcount + 0x10);
    }
    if ((local_f8 == (code *)0x0) || (iVar5 = (*local_f8)(4,in_local,_aclass_local,0), iVar5 != 0))
    {
      ret = 0;
      errtt = (ASN1_TEMPLATE *)_aclass_local->utype;
      for (; (long)ret < (long)_aclass_local->templates; ret = ret + 1) {
        if (((errtt->flags & 0x300) != 0) &&
           (pAVar10 = asn1_do_adb((ASN1_VALUE **)in_local,(ASN1_TEMPLATE *)errtt,0),
           pAVar10 != (ASN1_TEMPLATE *)0x0)) {
          ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)in_local,pAVar10);
          ASN1_template_free(ppAVar9,pAVar10);
        }
        errtt = errtt + 1;
      }
      ret = 0;
      errtt = (ASN1_TEMPLATE *)_aclass_local->utype;
      for (; (long)ret < (long)_aclass_local->templates; ret = ret + 1) {
        pAVar11 = asn1_do_adb((ASN1_VALUE **)in_local,(ASN1_TEMPLATE *)errtt,1);
        pAVar10 = (ASN1_TEMPLATE *)p;
        if (pAVar11 == (ASN1_TEMPLATE *)0x0) goto LAB_002f3118;
        ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)in_local,pAVar11);
        if (it_local == (ASN1_ITEM *)0x0) break;
        _i = q;
        if ((undefined1 *)(long)ret == (undefined1 *)((long)&_aclass_local->templates[-1].item + 7))
        {
          otag._1_1_ = false;
        }
        else {
          otag._1_1_ = (pAVar11->flags & 1) != 0;
        }
        pchptr._0_4_ = asn1_template_ex_d2i
                                 ((ASN1_VALUE **)ppAVar9,&q,(long)it_local,(ASN1_TEMPLATE *)pAVar11,
                                  otag._1_1_,buf,iVar4);
        pAVar10 = pAVar11;
        if ((int)pchptr == 0) goto LAB_002f3118;
        if ((int)pchptr == -1) {
          ASN1_template_free(ppAVar9,pAVar11);
        }
        else {
          it_local = (ASN1_ITEM *)((long)it_local - ((long)q - (long)_i));
        }
        errtt = errtt + 1;
      }
      if (it_local != (ASN1_ITEM *)0x0) {
        ERR_put_error(0xc,0,0xa8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x18e);
        pAVar10 = (ASN1_TEMPLATE *)p;
        break;
      }
      for (; (long)ret < (long)_aclass_local->templates; ret = ret + 1) {
        pAVar11 = asn1_do_adb((ASN1_VALUE **)in_local,(ASN1_TEMPLATE *)errtt,1);
        pAVar10 = (ASN1_TEMPLATE *)p;
        if (pAVar11 == (ASN1_TEMPLATE *)0x0) goto LAB_002f3118;
        if ((pAVar11->flags & 1) == 0) {
          p = (uchar *)pAVar11;
          ERR_put_error(0xc,0,0x79,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,0x1a1);
          pAVar10 = (ASN1_TEMPLATE *)p;
          goto LAB_002f3118;
        }
        ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)in_local,pAVar11);
        ASN1_template_free(ppAVar9,pAVar11);
        errtt = errtt + 1;
      }
      iVar4 = asn1_enc_save((ASN1_VALUE **)in_local,*(uchar **)len_local,
                            (int)q - (int)*(undefined8 *)len_local,_aclass_local);
      if ((iVar4 != 0) &&
         ((local_f8 == (code *)0x0 || (iVar4 = (*local_f8)(5,in_local,_aclass_local,0), iVar4 != 0))
         )) {
        *(uchar **)len_local = q;
        return 1;
      }
    }
    goto LAB_002f30fa;
  case '\x02':
    if (tt._4_4_ != -1) {
      ERR_put_error(0xc,0,0xc1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0xf9);
      pAVar10 = (ASN1_TEMPLATE *)p;
      break;
    }
    if ((void *)_aclass_local->tcount == (void *)0x0) {
      local_f0 = (code *)0x0;
    }
    else {
      local_f0 = *(code **)(_aclass_local->tcount + 0x10);
    }
    if ((local_f0 == (code *)0x0) || (iVar5 = (*local_f0)(4,in_local,_aclass_local,0), iVar5 != 0))
    {
      if (*in_local == (uchar *)0x0) {
        iVar5 = ASN1_item_ex_new((ASN1_VALUE **)in_local,_aclass_local);
        if (iVar5 == 0) {
          ERR_put_error(0xc,0,0x9e,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,0x10d);
          pAVar10 = (ASN1_TEMPLATE *)p;
          break;
        }
      }
      else {
        ret = asn1_get_choice_selector((ASN1_VALUE **)in_local,_aclass_local);
        if ((-1 < ret) && ((long)ret < (long)_aclass_local->templates)) {
          errtt = (ASN1_TEMPLATE *)(_aclass_local->utype + (long)ret * 0x20);
          ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)in_local,(ASN1_TEMPLATE *)errtt);
          ASN1_template_free(ppAVar9,(ASN1_TEMPLATE *)errtt);
          asn1_set_choice_selector((ASN1_VALUE **)in_local,-1,_aclass_local);
        }
      }
      q = *(uchar **)len_local;
      ret = 0;
      errtt = (ASN1_TEMPLATE *)_aclass_local->utype;
      for (; (long)ret < (long)_aclass_local->templates; ret = ret + 1) {
        ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)in_local,(ASN1_TEMPLATE *)errtt);
        pchptr._0_4_ = asn1_template_ex_d2i
                                 ((ASN1_VALUE **)ppAVar9,&q,(long)it_local,errtt,'\x01',buf,iVar4);
        if ((int)pchptr != -1) {
          if ((int)pchptr < 1) {
            p = (uchar *)errtt;
            ERR_put_error(0xc,0,0x9e,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                          ,0x120);
            pAVar10 = (ASN1_TEMPLATE *)p;
            goto LAB_002f3118;
          }
          break;
        }
        errtt = errtt + 1;
      }
      if ((ASN1_TEMPLATE *)(long)ret == _aclass_local->templates) {
        if (opt != '\0') {
          ASN1_item_ex_free((ASN1_VALUE **)in_local,_aclass_local);
          return -1;
        }
        ERR_put_error(0xc,0,0xa3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,300);
        pAVar10 = (ASN1_TEMPLATE *)p;
        break;
      }
      asn1_set_choice_selector((ASN1_VALUE **)in_local,ret,_aclass_local);
      if ((local_f0 == (code *)0x0) || (iVar4 = (*local_f0)(5,in_local,_aclass_local,0), iVar4 != 0)
         ) {
        *(uchar **)len_local = q;
        return 1;
      }
    }
LAB_002f30fa:
    ERR_put_error(0xc,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x1b4);
    pAVar10 = (ASN1_TEMPLATE *)p;
    break;
  default:
    return 0;
  case '\x04':
    if (tt._4_4_ == -1) {
      iVar4 = (**(code **)((long)_aclass_local->tcount + 0x10))
                        (in_local,len_local,it_local,_aclass_local,(int)opt,0);
      return iVar4;
    }
    ERR_put_error(0xc,0,0xc1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0xed);
    pAVar10 = (ASN1_TEMPLATE *)p;
    break;
  case '\x05':
    if (tt._4_4_ == -1) {
      q = *(uchar **)len_local;
      pchptr._0_4_ = asn1_check_tlen((long *)0x0,(int *)((long)&pchptr + 4),
                                     (uchar *)((long)&otag + 3),(char *)0x0,&q,(long)it_local,-1,0,
                                     '\x01');
      if ((int)pchptr == 0) {
        ERR_put_error(0xc,0,0x9e,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0xd2);
        pAVar10 = (ASN1_TEMPLATE *)p;
      }
      else if (otag._3_1_ == '\0') {
        uVar8 = ASN1_tag2bit(pchptr._4_4_);
        if ((uVar8 & (long)*(int *)&_aclass_local->field_0x4) != 0) {
          iVar4 = asn1_d2i_ex_primitive
                            ((ASN1_VALUE **)in_local,(uchar **)len_local,(long)it_local,
                             (ASN1_ITEM *)_aclass_local,pchptr._4_4_,0,'\0');
          return iVar4;
        }
        if (opt != '\0') {
          return -1;
        }
        ERR_put_error(0xc,0,0x9d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0xe5);
        pAVar10 = (ASN1_TEMPLATE *)p;
      }
      else {
        if (opt != '\0') {
          return -1;
        }
        ERR_put_error(0xc,0,0x9c,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0xdc);
        pAVar10 = (ASN1_TEMPLATE *)p;
      }
    }
    else {
      ERR_put_error(0xc,0,0xc1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0xca);
      pAVar10 = (ASN1_TEMPLATE *)p;
    }
  }
LAB_002f3118:
  p = (uchar *)pAVar10;
  ASN1_item_ex_free((ASN1_VALUE **)in_local,_aclass_local);
  if (p == (uchar *)0x0) {
    ERR_add_error_data(2,"Type=",_aclass_local->size);
  }
  else {
    ERR_add_error_data(4,"Field=",*(undefined8 *)(p + 0x10),", Type=",_aclass_local->size);
  }
  return 0;
}

Assistant:

static int asn1_item_ex_d2i(ASN1_VALUE **pval, const unsigned char **in,
                            long len, const ASN1_ITEM *it, int tag, int aclass,
                            char opt, CRYPTO_BUFFER *buf, int depth) {
  const ASN1_TEMPLATE *tt, *errtt = NULL;
  const unsigned char *p = NULL, *q;
  unsigned char oclass;
  char cst, isopt;
  int i;
  int otag;
  int ret = 0;
  ASN1_VALUE **pchptr;
  if (!pval) {
    return 0;
  }

  if (buf != NULL) {
    assert(CRYPTO_BUFFER_data(buf) <= *in &&
           *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf));
  }

  // Bound |len| to comfortably fit in an int. Lengths in this module often
  // switch between int and long without overflow checks.
  if (len > INT_MAX / 2) {
    len = INT_MAX / 2;
  }

  if (++depth > ASN1_MAX_CONSTRUCTED_NEST) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_TOO_DEEP);
    goto err;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        // tagging or OPTIONAL is currently illegal on an item template
        // because the flags can't get passed down. In practice this
        // isn't a problem: we include the relevant flags from the item
        // template in the template itself.
        if ((tag != -1) || opt) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OPTIONS_ON_ITEM_TEMPLATE);
          goto err;
        }
        return asn1_template_ex_d2i(pval, in, len, it->templates, opt, buf,
                                    depth);
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, tag, aclass, opt);
      break;

    case ASN1_ITYPE_MSTRING:
      // It never makes sense for multi-strings to have implicit tagging, so
      // if tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      p = *in;
      // Just read in tag and class
      ret = asn1_check_tlen(NULL, &otag, &oclass, NULL, &p, len, -1, 0, 1);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Must be UNIVERSAL class
      if (oclass != V_ASN1_UNIVERSAL) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_NOT_UNIVERSAL);
        goto err;
      }
      // Check tag matches bit map
      if (!(ASN1_tag2bit(otag) & it->utype)) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_WRONG_TAG);
        goto err;
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, otag, 0, 0);

    case ASN1_ITYPE_EXTERN: {
      // We don't support implicit tagging with external types.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      return ef->asn1_ex_d2i(pval, in, len, it, opt, NULL);
    }

    case ASN1_ITYPE_CHOICE: {
      // It never makes sense for CHOICE types to have implicit tagging, so if
      // tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      if (*pval) {
        // Free up and zero CHOICE value if initialised
        i = asn1_get_choice_selector(pval, it);
        if ((i >= 0) && (i < it->tcount)) {
          tt = it->templates + i;
          pchptr = asn1_get_field_ptr(pval, tt);
          ASN1_template_free(pchptr, tt);
          asn1_set_choice_selector(pval, -1, it);
        }
      } else if (!ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }
      // CHOICE type, try each possibility in turn
      p = *in;
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        pchptr = asn1_get_field_ptr(pval, tt);
        // We mark field as OPTIONAL so its absence can be recognised.
        ret = asn1_template_ex_d2i(pchptr, &p, len, tt, 1, buf, depth);
        // If field not present, try the next one
        if (ret == -1) {
          continue;
        }
        // If positive return, read OK, break loop
        if (ret > 0) {
          break;
        }
        // Otherwise must be an ASN1 parsing error
        errtt = tt;
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Did we fall off the end without reading anything?
      if (i == it->tcount) {
        // If OPTIONAL, this is OK
        if (opt) {
          // Free and zero it
          ASN1_item_ex_free(pval, it);
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NO_MATCHING_CHOICE_TYPE);
        goto err;
      }

      asn1_set_choice_selector(pval, i, it);
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    case ASN1_ITYPE_SEQUENCE: {
      p = *in;

      // If no IMPLICIT tagging set to SEQUENCE, UNIVERSAL
      if (tag == -1) {
        tag = V_ASN1_SEQUENCE;
        aclass = V_ASN1_UNIVERSAL;
      }
      // Get SEQUENCE length and update len, p
      ret = asn1_check_tlen(&len, NULL, NULL, &cst, &p, len, tag, aclass, opt);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      } else if (ret == -1) {
        return -1;
      }
      if (!cst) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_NOT_CONSTRUCTED);
        goto err;
      }

      if (!*pval && !ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      // Free up and zero any ADB found
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        if (tt->flags & ASN1_TFLG_ADB_MASK) {
          const ASN1_TEMPLATE *seqtt;
          ASN1_VALUE **pseqval;
          seqtt = asn1_do_adb(pval, tt, 0);
          if (seqtt == NULL) {
            continue;
          }
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        }
      }

      // Get each field entry
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        // Have we ran out of data?
        if (!len) {
          break;
        }
        q = p;
        // This determines the OPTIONAL flag value. The field cannot be
        // omitted if it is the last of a SEQUENCE and there is still
        // data to be read. This isn't strictly necessary but it
        // increases efficiency in some cases.
        if (i == (it->tcount - 1)) {
          isopt = 0;
        } else {
          isopt = (seqtt->flags & ASN1_TFLG_OPTIONAL) != 0;
        }
        // attempt to read in field, allowing each to be OPTIONAL

        ret = asn1_template_ex_d2i(pseqval, &p, len, seqtt, isopt, buf, depth);
        if (!ret) {
          errtt = seqtt;
          goto err;
        } else if (ret == -1) {
          // OPTIONAL component absent. Free and zero the field.
          ASN1_template_free(pseqval, seqtt);
          continue;
        }
        // Update length
        len -= p - q;
      }

      // Check all data read
      if (len) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_LENGTH_MISMATCH);
        goto err;
      }

      // If we get here we've got no more data in the SEQUENCE, however we
      // may not have read all fields so check all remaining are OPTIONAL
      // and clear any that are.
      for (; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        if (seqtt->flags & ASN1_TFLG_OPTIONAL) {
          ASN1_VALUE **pseqval;
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        } else {
          errtt = seqtt;
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_FIELD_MISSING);
          goto err;
        }
      }
      // Save encoding
      if (!asn1_enc_save(pval, *in, p - *in, it, buf)) {
        goto auxerr;
      }
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    default:
      return 0;
  }
auxerr:
  OPENSSL_PUT_ERROR(ASN1, ASN1_R_AUX_ERROR);
err:
  ASN1_item_ex_free(pval, it);
  if (errtt) {
    ERR_add_error_data(4, "Field=", errtt->field_name, ", Type=", it->sname);
  } else {
    ERR_add_error_data(2, "Type=", it->sname);
  }
  return 0;
}